

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O3

pair<std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
* findFiles_abi_cxx11_(void)

{
  int iVar1;
  pair<std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
  *in_RDI;
  vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>> *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined1 auVar3 [16];
  path local_170;
  recursive_directory_iterator local_148;
  path local_138;
  pair<std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
  *local_110;
  undefined1 auStack_108 [8];
  recursive_directory_iterator __end1;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  sourcePaths;
  undefined1 auStack_d8 [8];
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  headerPaths;
  recursive_directory_iterator local_b8;
  undefined1 local_a8 [8];
  recursive_directory_iterator __begin1;
  long local_88 [3];
  recursive_directory_iterator local_70;
  path local_60;
  path *local_38;
  
  __end1._M_dirs._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  headerPaths.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_d8 = (undefined1  [8])0x0;
  headerPaths.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::filesystem::current_path_abi_cxx11_();
  std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            (&local_70,&local_170,none,(error_code *)0x0);
  std::filesystem::__cxx11::path::~path(&local_170);
  if (local_70._M_dirs._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    __begin1._M_dirs._M_ptr = (element_type *)0x0;
  }
  else {
    __begin1._M_dirs._M_ptr = (element_type *)local_70._M_dirs._M_refcount._M_pi;
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_70._M_dirs._M_refcount._M_pi + 8) =
           *(int *)(local_70._M_dirs._M_refcount._M_pi + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_70._M_dirs._M_refcount._M_pi + 8) =
           *(int *)(local_70._M_dirs._M_refcount._M_pi + 8) + 1;
    }
  }
  local_b8._M_dirs._M_ptr = (element_type *)0x0;
  local_b8._M_dirs._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&local_b8);
  local_148._M_dirs._M_ptr = local_70._M_dirs._M_ptr;
  local_148._M_dirs._M_refcount._M_pi = local_70._M_dirs._M_refcount._M_pi;
  if (local_70._M_dirs._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_70._M_dirs._M_refcount._M_pi + 8) =
           *(int *)(local_70._M_dirs._M_refcount._M_pi + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_70._M_dirs._M_refcount._M_pi + 8) =
           *(int *)(local_70._M_dirs._M_refcount._M_pi + 8) + 1;
    }
  }
  auStack_108 = (undefined1  [8])0x0;
  __end1._M_dirs._M_ptr = (element_type *)0x0;
  local_110 = in_RDI;
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&local_148);
  do {
    if (__begin1._M_dirs._M_ptr == __end1._M_dirs._M_ptr) {
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                ((recursive_directory_iterator *)auStack_108);
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                ((recursive_directory_iterator *)local_a8);
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                (&local_70);
      std::
      pair<std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
      ::
      pair<std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_&,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_&,_true>
                (local_110,
                 (vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                  *)&__end1._M_dirs._M_refcount,
                 (vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                  *)auStack_d8);
      std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
      ~vector((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
               *)auStack_d8);
      std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
      ~vector((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
               *)&__end1._M_dirs._M_refcount);
      return local_110;
    }
    local_38 = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*
                                 ((recursive_directory_iterator *)local_a8);
    auVar3 = std::filesystem::__cxx11::path::_M_find_extension();
    if (auVar3._8_8_ == -1 || auVar3._0_8_ == 0) {
      std::filesystem::__cxx11::path::path(&local_170);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_60,auVar3._0_8_);
      std::filesystem::__cxx11::path::path(&local_170,&local_60._M_pathname,auto_format);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_pathname._M_dataplus._M_p != &local_60._M_pathname.field_2) {
        operator_delete(local_60._M_pathname._M_dataplus._M_p,
                        local_60._M_pathname.field_2._M_allocated_capacity + 1);
      }
    }
    std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
              (&local_60,(char (*) [5])0x10a08b,auto_format);
    iVar1 = std::filesystem::__cxx11::path::compare(&local_170);
    if (iVar1 == 0) {
      std::filesystem::__cxx11::path::~path(&local_60);
      std::filesystem::__cxx11::path::~path(&local_170);
      this = (vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
              *)&__end1._M_dirs._M_refcount;
LAB_00108003:
      std::vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>::
      emplace_back<std::filesystem::__cxx11::path_const&>(this,local_38);
    }
    else {
      auVar3 = std::filesystem::__cxx11::path::_M_find_extension();
      if (auVar3._8_8_ == -1 || auVar3._0_8_ == 0) {
        std::filesystem::__cxx11::path::path(&local_138);
      }
      else {
        p_Var2 = &__begin1._M_dirs._M_refcount;
        std::__cxx11::string::substr((ulong)p_Var2,auVar3._0_8_);
        std::filesystem::__cxx11::path::path(&local_138,(string_type *)p_Var2,auto_format);
        if (__begin1._M_dirs._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88) {
          operator_delete(__begin1._M_dirs._M_refcount._M_pi,local_88[0] + 1);
        }
      }
      p_Var2 = &__begin1._M_dirs._M_refcount;
      std::filesystem::__cxx11::path::path<char[3],std::filesystem::__cxx11::path>
                ((path *)p_Var2,(char (*) [3])".c",auto_format);
      iVar1 = std::filesystem::__cxx11::path::compare(&local_138);
      std::filesystem::__cxx11::path::~path((path *)p_Var2);
      std::filesystem::__cxx11::path::~path(&local_138);
      std::filesystem::__cxx11::path::~path(&local_60);
      std::filesystem::__cxx11::path::~path(&local_170);
      this = (vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
              *)&__end1._M_dirs._M_refcount;
      if (iVar1 == 0) goto LAB_00108003;
      auVar3 = std::filesystem::__cxx11::path::_M_find_extension();
      if (auVar3._8_8_ == -1 || auVar3._0_8_ == 0) {
        std::filesystem::__cxx11::path::path(&local_170);
      }
      else {
        std::__cxx11::string::substr((ulong)&local_60,auVar3._0_8_);
        std::filesystem::__cxx11::path::path(&local_170,&local_60._M_pathname,auto_format);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_pathname._M_dataplus._M_p != &local_60._M_pathname.field_2) {
          operator_delete(local_60._M_pathname._M_dataplus._M_p,
                          local_60._M_pathname.field_2._M_allocated_capacity + 1);
        }
      }
      std::filesystem::__cxx11::path::path<char[3],std::filesystem::__cxx11::path>
                (&local_60,(char (*) [3])".h",auto_format);
      iVar1 = std::filesystem::__cxx11::path::compare(&local_170);
      if (iVar1 == 0) {
        std::filesystem::__cxx11::path::~path(&local_60);
        std::filesystem::__cxx11::path::~path(&local_170);
        this = (vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
                *)auStack_d8;
        goto LAB_00108003;
      }
      auVar3 = std::filesystem::__cxx11::path::_M_find_extension();
      if (auVar3._8_8_ == -1 || auVar3._0_8_ == 0) {
        std::filesystem::__cxx11::path::path(&local_138);
      }
      else {
        p_Var2 = &__begin1._M_dirs._M_refcount;
        std::__cxx11::string::substr((ulong)p_Var2,auVar3._0_8_);
        std::filesystem::__cxx11::path::path(&local_138,(string_type *)p_Var2,auto_format);
        if (__begin1._M_dirs._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88) {
          operator_delete(__begin1._M_dirs._M_refcount._M_pi,local_88[0] + 1);
        }
      }
      p_Var2 = &__begin1._M_dirs._M_refcount;
      std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
                ((path *)p_Var2,(char (*) [5])".hpp",auto_format);
      iVar1 = std::filesystem::__cxx11::path::compare(&local_138);
      std::filesystem::__cxx11::path::~path((path *)p_Var2);
      std::filesystem::__cxx11::path::~path(&local_138);
      std::filesystem::__cxx11::path::~path(&local_60);
      std::filesystem::__cxx11::path::~path(&local_170);
      this = (vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
              *)auStack_d8;
      if (iVar1 == 0) goto LAB_00108003;
    }
    std::filesystem::__cxx11::recursive_directory_iterator::operator++
              ((recursive_directory_iterator *)local_a8);
  } while( true );
}

Assistant:

std::pair< std::vector<fs::path>, std::vector<fs::path>> findFiles()
{
    std::vector<fs::path> sourcePaths;
    std::vector<fs::path> headerPaths;
    for (auto& entry : fs::recursive_directory_iterator(fs::current_path())) {
        const auto& path = entry.path();
        if (path.extension() == ".cpp" || path.extension() == ".c") {
            sourcePaths.emplace_back(path);
        }
        else if (path.extension() == ".h" || path.extension() == ".hpp") {
            headerPaths.emplace_back(path);
        }
    }
    return { sourcePaths, headerPaths };
}